

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_sleep.c
# Opt level: O0

void tool_go_sleep(long ms)

{
  undefined1 local_20 [8];
  timeval timeout;
  long ms_local;
  
  local_20 = (undefined1  [8])(ms / 1000);
  timeout.tv_usec = ms % 1000;
  timeout.tv_sec = (__time_t)((int)timeout.tv_usec * 1000);
  select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_20);
  return;
}

Assistant:

void tool_go_sleep(long ms)
{
#if defined(MSDOS)
  delay(ms);
#elif defined(_WIN32)
  Sleep((DWORD)ms);
#else
  struct timeval timeout;
  timeout.tv_sec = ms / 1000L;
  ms = ms % 1000L;
  timeout.tv_usec = (int)ms * 1000;
  select(0, NULL,  NULL, NULL, &timeout);
#endif
}